

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O0

string * anon_unknown.dwarf_2992::sanitize(string *s)

{
  bool bVar1;
  string *in_RDI;
  const_iterator end;
  const_iterator i;
  string *result;
  string *__lhs;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)__lhs,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_20);
    std::__cxx11::string::push_back((char)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  return __lhs;
}

Assistant:

std::string sanitize(const std::string &s) {
  std::string result;
  for (std::string::const_iterator i = s.begin(), end = s.end(); i != end; ++i)
    result.push_back(static_cast<char>(*i & 0xff));
  return result;
}